

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3InRhsIsConstant(Expr *pIn)

{
  Expr *pEVar1;
  int iVar2;
  int res;
  Expr *pLHS;
  Expr *pIn_local;
  
  pEVar1 = pIn->pLeft;
  pIn->pLeft = (Expr *)0x0;
  iVar2 = sqlite3ExprIsConstant(pIn);
  pIn->pLeft = pEVar1;
  return iVar2;
}

Assistant:

static int sqlite3InRhsIsConstant(Expr *pIn){
  Expr *pLHS;
  int res;
  assert( !ExprHasProperty(pIn, EP_xIsSelect) );
  pLHS = pIn->pLeft;
  pIn->pLeft = 0;
  res = sqlite3ExprIsConstant(pIn);
  pIn->pLeft = pLHS;
  return res;
}